

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLESelect<signed_char>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t sel_count)

{
  data_ptr_t pdVar1;
  RLEScanState<signed_char> *scan_state;
  idx_t iVar2;
  idx_t iVar3;
  InternalException *this;
  idx_t iVar4;
  ulong uVar5;
  data_ptr_t data_pointer;
  idx_t iVar6;
  ulong uVar7;
  rle_count_t *index_pointer;
  string local_50;
  
  scan_state = (RLEScanState<signed_char> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar1 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = pdVar1 + segment->offset + 8;
  index_pointer = (rle_count_t *)(pdVar1 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((vector_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<signed_char>(scan_state,index_pointer,(char *)data_pointer,0x800,result);
    return;
  }
  pdVar1 = result->data;
  iVar3 = 0;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (sel_count != 0) {
    iVar2 = 0;
    uVar7 = 0;
    do {
      iVar3 = iVar2;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)sel->sel_vector[iVar2];
      }
      uVar5 = iVar3 - uVar7;
      if (iVar3 < uVar7) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "Error in RLESelect - selection vector indices are not ordered","");
        InternalException::InternalException(this,&local_50);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar4 = scan_state->entry_pos;
      if (uVar5 != 0) {
        iVar6 = scan_state->position_in_entry;
        do {
          uVar7 = index_pointer[iVar4] - iVar6;
          if (uVar5 < uVar7) {
            uVar7 = uVar5;
          }
          iVar6 = iVar6 + uVar7;
          if (index_pointer[iVar4] <= iVar6) {
            iVar4 = iVar4 + 1;
            scan_state->entry_pos = iVar4;
            iVar6 = 0;
          }
          uVar5 = uVar5 - uVar7;
        } while (uVar5 != 0);
        scan_state->position_in_entry = iVar6;
      }
      pdVar1[iVar2] = data_pointer[iVar4];
      iVar2 = iVar2 + 1;
      uVar7 = iVar3;
    } while (iVar2 != sel_count);
  }
  uVar7 = vector_count - iVar3;
  if (uVar7 != 0) {
    iVar3 = scan_state->entry_pos;
    iVar2 = scan_state->position_in_entry;
    do {
      uVar5 = index_pointer[iVar3] - iVar2;
      if (uVar7 < uVar5) {
        uVar5 = uVar7;
      }
      iVar2 = iVar2 + uVar5;
      if (index_pointer[iVar3] <= iVar2) {
        iVar3 = iVar3 + 1;
        scan_state->entry_pos = iVar3;
        iVar2 = 0;
      }
      uVar7 = uVar7 - uVar5;
    } while (uVar7 != 0);
    scan_state->position_in_entry = iVar2;
  }
  return;
}

Assistant:

void RLESelect(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result,
               const SelectionVector &sel, idx_t sel_count) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run we don't need to select at all
	if (CanEmitConstantVector<true>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos], vector_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, vector_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t prev_idx = 0;
	for (idx_t i = 0; i < sel_count; i++) {
		auto next_idx = sel.get_index(i);
		if (next_idx < prev_idx) {
			throw InternalException("Error in RLESelect - selection vector indices are not ordered");
		}
		// skip forward to the next index
		scan_state.SkipInternal(index_pointer, next_idx - prev_idx);
		// read the element
		result_data[i] = data_pointer[scan_state.entry_pos];
		// move the next to the prev
		prev_idx = next_idx;
	}
	// skip the tail
	scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
}